

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O0

void __thiscall AomLeb128_EncodeTest_Test::TestBody(AomLeb128_EncodeTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  size_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t bytes_written;
  uint8_t write_buffer [4];
  size_t kWriteBufferSize;
  uint8_t expected_bytes [3];
  uint32_t test_value;
  AssertHelper *in_stack_ffffffffffffff00;
  unsigned_long *in_stack_ffffffffffffff08;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  uint8_t *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffff28;
  Type in_stack_ffffffffffffff2c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff30;
  AssertionResult local_a8;
  ulong local_98;
  Message *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar2;
  AssertionResult local_78;
  uint local_64;
  undefined4 local_40;
  int local_3c;
  AssertionResult local_38;
  ulong local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined2 local_10;
  undefined1 local_e;
  undefined4 local_c;
  
  local_c = 0x98765;
  local_e = 0x26;
  local_10 = 0x8ee5;
  local_18 = 4;
  local_1c = 0;
  local_28 = 0;
  local_3c = aom_uleb_encode(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                             (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                             (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                            );
  local_40 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffff18,
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             (int *)in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3adee4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff00);
    testing::Message::~Message((Message *)0x3adf41);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3adfaf);
  if (local_64 == 0) {
    uVar2 = 3;
    this_01 = &local_78;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((char *)in_stack_ffffffffffffff18,
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08,(uint *)in_stack_ffffffffffffff00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff18 =
           (uint8_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3ae062);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff30,type,&this_01->success_,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(uVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
                );
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff00);
      testing::Message::~Message((Message *)0x3ae0b6);
    }
    local_64 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae121);
    if (local_64 == 0) {
      for (local_98 = 0; local_98 < local_28; local_98 = local_98 + 1) {
        this_00 = &local_a8;
        testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                  ((char *)in_stack_ffffffffffffff18,
                   (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   &this_00->success_,(uchar *)in_stack_ffffffffffffff00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
        in_stack_ffffffffffffff17 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff30);
          in_stack_ffffffffffffff00 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x3ae1e1);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffff30,type,&this_01->success_,
                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(uVar2,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
          testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff00);
          testing::Message::~Message((Message *)0x3ae22f);
        }
        local_64 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae291);
        if (local_64 != 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

TEST(AomLeb128, EncodeTest) {
  const uint32_t test_value = 0x98765;  // 624485
  const uint8_t expected_bytes[3] = { 0xE5, 0x8E, 0x26 };
  const size_t kWriteBufferSize = 4;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t bytes_written = 0;
  ASSERT_EQ(aom_uleb_encode(test_value, kWriteBufferSize, &write_buffer[0],
                            &bytes_written),
            0);
  ASSERT_EQ(bytes_written, 3u);
  for (size_t i = 0; i < bytes_written; ++i) {
    ASSERT_EQ(write_buffer[i], expected_bytes[i]);
  }
}